

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# csv_encoder.cpp
# Opt level: O2

void __thiscall
duckdb::CSVEncoder::CSVEncoder
          (CSVEncoder *this,DBConfig *config,string *encoding_name_to_find,idx_t buffer_size)

{
  EncodingFunction *pEVar1;
  ostream *poVar2;
  InvalidInputException *this_00;
  idx_t encoded_size;
  pointer prVar3;
  optional_ptr<duckdb::EncodingFunction,_true> function;
  vector<std::reference_wrapper<duckdb::EncodingFunction>,_true> loaded_encodings;
  string local_1c8;
  ostringstream error;
  
  (this->encoding_name)._M_dataplus._M_p = (pointer)&(this->encoding_name).field_2;
  (this->encoding_name)._M_string_length = 0;
  (this->encoding_name).field_2._M_local_buf[0] = '\0';
  (this->encoded_buffer).cur_pos = 0;
  (this->encoded_buffer).actual_encoded_buffer_size = 0;
  (this->encoded_buffer).last_buffer = false;
  this->has_pass_on_byte = false;
  (this->encoded_buffer).encoded_buffer._M_t.
  super___uniq_ptr_impl<char,_std::default_delete<char[]>_>._M_t.
  super__Tuple_impl<0UL,_char_*,_std::default_delete<char[]>_>.super__Head_base<0UL,_char_*,_false>.
  _M_head_impl = (char *)0x0;
  (this->encoded_buffer).encoded_buffer_size = 0;
  (this->remaining_bytes_buffer).cur_pos = 0;
  (this->remaining_bytes_buffer).actual_encoded_buffer_size = 0;
  (this->remaining_bytes_buffer).last_buffer = false;
  (this->remaining_bytes_buffer).encoded_buffer._M_t.
  super___uniq_ptr_impl<char,_std::default_delete<char[]>_>._M_t.
  super__Tuple_impl<0UL,_char_*,_std::default_delete<char[]>_>.super__Head_base<0UL,_char_*,_false>.
  _M_head_impl = (char *)0x0;
  (this->remaining_bytes_buffer).encoded_buffer_size = 0;
  (this->encoding_function).ptr = (EncodingFunction *)0x0;
  StringUtil::Lower((string *)&error,encoding_name_to_find);
  ::std::__cxx11::string::operator=((string *)this,(string *)&error);
  ::std::__cxx11::string::~string((string *)&error);
  function = DBConfig::GetEncodeFunction(config,encoding_name_to_find);
  if (function.ptr != (EncodingFunction *)0x0) {
    encoded_size = 2;
    if ((buffer_size & 0xfffffffffffffffe) != 0) {
      encoded_size = buffer_size & 0xfffffffffffffffe;
    }
    CSVEncoderBuffer::Initialize(&this->encoded_buffer,encoded_size);
    pEVar1 = optional_ptr<duckdb::EncodingFunction,_true>::operator->(&function);
    CSVEncoderBuffer::Initialize(&this->remaining_bytes_buffer,pEVar1->max_bytes_per_iteration);
    (this->encoding_function).ptr = function.ptr;
    return;
  }
  DBConfig::GetLoadedEncodedFunctions(&loaded_encodings,config);
  ::std::__cxx11::ostringstream::ostringstream((ostringstream *)&error);
  poVar2 = ::std::operator<<((ostream *)&error,"The CSV Reader does not support the encoding: \"");
  poVar2 = ::std::operator<<(poVar2,(string *)encoding_name_to_find);
  ::std::operator<<(poVar2,"\"\n");
  poVar2 = ::std::operator<<((ostream *)&error,"The currently supported encodings are: ");
  ::std::operator<<(poVar2,'\n');
  for (prVar3 = loaded_encodings.
                super_vector<std::reference_wrapper<duckdb::EncodingFunction>,_std::allocator<std::reference_wrapper<duckdb::EncodingFunction>_>_>
                .
                super__Vector_base<std::reference_wrapper<duckdb::EncodingFunction>,_std::allocator<std::reference_wrapper<duckdb::EncodingFunction>_>_>
                ._M_impl.super__Vector_impl_data._M_start;
      prVar3 != loaded_encodings.
                super_vector<std::reference_wrapper<duckdb::EncodingFunction>,_std::allocator<std::reference_wrapper<duckdb::EncodingFunction>_>_>
                .
                super__Vector_base<std::reference_wrapper<duckdb::EncodingFunction>,_std::allocator<std::reference_wrapper<duckdb::EncodingFunction>_>_>
                ._M_impl.super__Vector_impl_data._M_finish; prVar3 = prVar3 + 1) {
    poVar2 = ::std::operator<<((ostream *)&error,"*  ");
    ::std::__cxx11::string::string((string *)&local_1c8,(string *)&prVar3->_M_data->name);
    poVar2 = ::std::operator<<(poVar2,(string *)&local_1c8);
    ::std::operator<<(poVar2,'\n');
    ::std::__cxx11::string::~string((string *)&local_1c8);
  }
  this_00 = (InvalidInputException *)__cxa_allocate_exception(0x10);
  ::std::__cxx11::stringbuf::str();
  InvalidInputException::InvalidInputException(this_00,&local_1c8);
  __cxa_throw(this_00,&InvalidInputException::typeinfo,::std::runtime_error::~runtime_error);
}

Assistant:

CSVEncoder::CSVEncoder(const DBConfig &config, const string &encoding_name_to_find, idx_t buffer_size) {
	encoding_name = StringUtil::Lower(encoding_name_to_find);
	auto function = config.GetEncodeFunction(encoding_name_to_find);
	if (!function) {
		auto loaded_encodings = config.GetLoadedEncodedFunctions();
		std::ostringstream error;
		error << "The CSV Reader does not support the encoding: \"" << encoding_name_to_find << "\"\n";
		error << "The currently supported encodings are: " << '\n';
		for (auto &encoding_function : loaded_encodings) {
			error << "*  " << encoding_function.get().GetName() << '\n';
		}
		throw InvalidInputException(error.str());
	}
	// We ensure that the encoded buffer size is an even number to make the two byte lookup on utf-16 work
	idx_t encoded_buffer_size = buffer_size % 2 != 0 ? buffer_size - 1 : buffer_size;
	if (encoded_buffer_size == 0) {
		// This might happen if buffer size = 1
		encoded_buffer_size = 2;
	}
	D_ASSERT(encoded_buffer_size > 0);
	encoded_buffer.Initialize(encoded_buffer_size);
	remaining_bytes_buffer.Initialize(function->GetBytesPerIteration());
	encoding_function = function;
}